

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

DefaultCaseItemSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DefaultCaseItemSyntax,slang::parsing::Token,slang::parsing::Token,slang::syntax::SyntaxNode&>
          (BumpAllocator *this,Token *args,Token *args_1,SyntaxNode *args_2)

{
  Token colon;
  Token defaultKeyword;
  DefaultCaseItemSyntax *pDVar1;
  Info *in_RCX;
  long in_RDX;
  Info *in_RSI;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  BumpAllocator *in_stack_ffffffffffffffd8;
  
  pDVar1 = (DefaultCaseItemSyntax *)
           allocate(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  defaultKeyword.info = in_RSI;
  defaultKeyword.kind = (short)in_RDX;
  defaultKeyword._2_1_ = (char)((ulong)in_RDX >> 0x10);
  defaultKeyword.numFlags.raw = (char)((ulong)in_RDX >> 0x18);
  defaultKeyword.rawLen = (int)((ulong)in_RDX >> 0x20);
  colon.info = in_RCX;
  colon._0_8_ = in_RSI->location;
  slang::syntax::DefaultCaseItemSyntax::DefaultCaseItemSyntax
            ((DefaultCaseItemSyntax *)in_RSI->rawTextPtr,defaultKeyword,colon,
             *(SyntaxNode **)(in_RDX + 8));
  return pDVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }